

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[86],kj::_::DebugComparison<kj::_::(anonymous_namespace)::SiPair&,kj::_::(anonymous_namespace)::SiPair>&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [86],
               DebugComparison<kj::_::(anonymous_namespace)::SiPair_&,_kj::_::(anonymous_namespace)::SiPair>
               *params_1)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 in_register_00000037;
  char argValues [2] [7];
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  char *apcStack_68 [2];
  size_t sStack_58;
  ArrayDisposer *pAStack_50;
  String local_48;
  StringPtr local_30;
  char *local_20;
  undefined8 local_18;
  
  str<char_const(&)[86]>
            ((kj *)&stack0xffffffffffffff88,
             (char (*) [86])
             "failed: expected KJ_ASSERT_NONNULL(table.find<0>(\"corge\")) == (SiPair {\"corge\", 789})"
            );
  local_20 = "(can\'t stringify)";
  local_18 = 0x12;
  local_30.content.ptr = "(can\'t stringify)";
  local_30.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_48,(_ *)&local_20,(StringPtr *)(CONCAT17(in_register_00000037,line) + 0x20),
             &local_30,(StringPtr *)params);
  apcStack_68[1] = local_48.content.ptr;
  sStack_58 = local_48.content.size_;
  pAStack_50 = local_48.content.disposer;
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x1d36c5,&stack0xffffffffffffff88,
              in_stack_ffffffffffffff88);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)apcStack_68 + lVar3))
                (*(undefined8 **)((long)apcStack_68 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}